

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O3

LengthPercentage
Rml::ComputeLengthPercentage
          (Property *property,float font_size,float document_font_size,float dp_ratio,
          Vector2f vp_dimensions)

{
  NumericValue value;
  bool bVar1;
  undefined4 in_XMM3_Dc;
  undefined4 in_XMM3_Dd;
  float local_1c;
  undefined1 local_18 [16];
  
  bVar1 = property->unit != PERCENT;
  if (bVar1) {
    local_18._8_4_ = in_XMM3_Dc;
    local_18._0_8_ = vp_dimensions;
    local_18._12_4_ = in_XMM3_Dd;
    value = Property::GetNumericValue(property);
    local_1c = ComputeLength(value,font_size,document_font_size,dp_ratio,(Vector2f)local_18._0_8_);
  }
  else {
    local_1c = 0.0;
    Variant::GetInto<float,_0>(&property->value,&local_1c);
  }
  return (LengthPercentage)((ulong)(uint)local_1c << 0x20 | (ulong)!bVar1);
}

Assistant:

Style::LengthPercentage ComputeLengthPercentage(const Property* property, float font_size, float document_font_size, float dp_ratio,
	Vector2f vp_dimensions)
{
	using namespace Style;
	if (property->unit == Unit::PERCENT)
		return LengthPercentage(LengthPercentage::Percentage, property->Get<float>());

	return LengthPercentage(LengthPercentage::Length,
		ComputeLength(property->GetNumericValue(), font_size, document_font_size, dp_ratio, vp_dimensions));
}